

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uoffset_t __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::ReferTo(FlatBufferBuilderImpl<false> *this,uoffset_t off)

{
  type size;
  uint uVar1;
  uoffset_t off_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  Align(this,4);
  size = GetSizeRelative32BitRegion<false>(this);
  uVar1 = ReferTo<unsigned_int>(this,off,size);
  return uVar1;
}

Assistant:

uoffset_t ReferTo(uoffset_t off) {
    // Align to ensure GetSizeRelative32BitRegion() below is correct.
    Align(sizeof(uoffset_t));
    // 32-bit offsets are relative to the tail of the 32-bit region of the
    // buffer. For most cases (without 64-bit entities) this is equivalent to
    // size of the whole buffer (e.g. GetSize())
    return ReferTo(off, GetSizeRelative32BitRegion());
  }